

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

void __thiscall icu_63::TimeZoneNamesDelegate::~TimeZoneNamesDelegate(TimeZoneNamesDelegate *this)

{
  void *in_RSI;
  TimeZoneNamesDelegate *this_local;
  
  ~TimeZoneNamesDelegate(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

TimeZoneNamesDelegate::~TimeZoneNamesDelegate() {
    umtx_lock(&gTimeZoneNamesLock);
    {
        if (fTZnamesCacheEntry) {
            U_ASSERT(fTZnamesCacheEntry->refCount > 0);
            // Just decrement the reference count
            fTZnamesCacheEntry->refCount--;
        }
    }
    umtx_unlock(&gTimeZoneNamesLock);
}